

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

bool __thiscall embree::TokenStream::decDigits1(TokenStream *this,string *str_o)

{
  int *piVar1;
  bool bVar2;
  string str;
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  local_40 = 0;
  local_38[0] = 0;
  bVar2 = false;
  local_48 = local_38;
  while( true ) {
    piVar1 = Stream<int>::peek((this->cin).ptr);
    if (9 < *piVar1 - 0x30U) break;
    Stream<int>::get((this->cin).ptr);
    bVar2 = true;
    std::__cxx11::string::push_back((char)&local_48);
  }
  if (bVar2) {
    std::__cxx11::string::_M_append((char *)str_o,(ulong)local_48);
  }
  else {
    Stream<int>::unget((this->cin).ptr,local_40);
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return bVar2;
}

Assistant:

bool TokenStream::decDigits1(std::string& str_o)
  {
    bool ok = false;
    std::string str;
    while (isDigit(cin->peek())) { ok = true; str += (char)cin->get(); }
    if (ok) str_o += str; else cin->unget(str.size());
    return ok;
  }